

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateBatchnormLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  uint64_t uVar1;
  NeuralNetworkLayer *pNVar2;
  bool bVar3;
  WeightParamType WVar4;
  BatchnormLayerParams *pBVar5;
  WeightParams *param;
  WeightParams *pWVar6;
  WeightParams *param_00;
  WeightParams *param_01;
  string *psVar7;
  WeightParams *weight;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  bool local_2b4;
  bool local_2b3;
  bool local_2b2;
  allocator<char> local_261;
  string local_260;
  allocator<char> local_239;
  string local_238;
  byte local_212;
  allocator<char> local_211;
  string local_210;
  allocator<char> local_1e9;
  string local_1e8;
  byte local_1c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  undefined1 local_1a0 [8];
  string err_1;
  string local_178;
  allocator<char> local_151;
  string local_150;
  byte local_12a;
  allocator<char> local_129;
  string local_128;
  allocator<char> local_101;
  string local_100;
  byte local_d9;
  uint64_t local_d8;
  uint64_t num_channels;
  undefined1 local_b0 [8];
  string err;
  undefined1 local_88 [4];
  bool invalid_params;
  bool has_f16_params;
  bool has_f32_params;
  byte local_62;
  allocator<char> local_61;
  string local_60;
  byte local_3a;
  byte local_39;
  uint local_38;
  byte local_21;
  NeuralNetworkLayer *local_20;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result *_result;
  
  local_21 = 0;
  local_20 = layer;
  layer_local = (NeuralNetworkLayer *)this;
  this_local = (NeuralNetworkSpecValidator *)__return_storage_ptr__;
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar3 = Result::good(__return_storage_ptr__);
  if (!bVar3) {
    local_21 = 1;
  }
  local_38 = (uint)!bVar3;
  if ((local_21 & 1) == 0) {
    Result::~Result(__return_storage_ptr__);
  }
  if (local_38 != 0) {
    return __return_storage_ptr__;
  }
  local_39 = 0;
  validateOutputCount(__return_storage_ptr__,local_20,1,1);
  bVar3 = Result::good(__return_storage_ptr__);
  if (!bVar3) {
    local_39 = 1;
  }
  local_38 = (uint)!bVar3;
  if ((local_39 & 1) == 0) {
    Result::~Result(__return_storage_ptr__);
  }
  pNVar2 = local_20;
  if (local_38 != 0) {
    return __return_storage_ptr__;
  }
  if ((this->ndArrayInterpretation & 1U) != 0) {
    local_3a = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"Batchnorm",&local_61);
    validateInputOutputRankEquality(__return_storage_ptr__,pNVar2,&local_60,&this->blobNameToRank);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    bVar3 = Result::good(__return_storage_ptr__);
    if (!bVar3) {
      local_3a = 1;
    }
    local_38 = (uint)!bVar3;
    if ((local_3a & 1) == 0) {
      Result::~Result(__return_storage_ptr__);
    }
    pNVar2 = local_20;
    if (local_38 != 0) {
      return __return_storage_ptr__;
    }
    local_62 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_88,"Batchnorm",(allocator<char> *)(err.field_2._M_local_buf + 0xf));
    validateRankCount(__return_storage_ptr__,pNVar2,(string *)local_88,3,-1,&this->blobNameToRank);
    std::__cxx11::string::~string((string *)local_88);
    std::allocator<char>::~allocator((allocator<char> *)(err.field_2._M_local_buf + 0xf));
    bVar3 = Result::good(__return_storage_ptr__);
    if (!bVar3) {
      local_62 = 1;
    }
    local_38 = (uint)!bVar3;
    if ((local_62 & 1) == 0) {
      Result::~Result(__return_storage_ptr__);
    }
    if (local_38 != 0) {
      return __return_storage_ptr__;
    }
  }
  pBVar5 = Specification::NeuralNetworkLayer::batchnorm(local_20);
  Specification::BatchnormLayerParams::gamma(pBVar5,extraout_XMM0_Qa);
  WVar4 = valueType(param);
  local_2b2 = true;
  if (WVar4 != FLOAT32) {
    pBVar5 = Specification::NeuralNetworkLayer::batchnorm(local_20);
    pWVar6 = Specification::BatchnormLayerParams::beta(pBVar5);
    WVar4 = valueType(pWVar6);
    local_2b2 = true;
    if (WVar4 != FLOAT32) {
      pBVar5 = Specification::NeuralNetworkLayer::batchnorm(local_20);
      pWVar6 = Specification::BatchnormLayerParams::mean(pBVar5);
      WVar4 = valueType(pWVar6);
      local_2b2 = true;
      if (WVar4 != FLOAT32) {
        pBVar5 = Specification::NeuralNetworkLayer::batchnorm(local_20);
        pWVar6 = Specification::BatchnormLayerParams::variance(pBVar5);
        WVar4 = valueType(pWVar6);
        local_2b2 = WVar4 == FLOAT32;
      }
    }
  }
  err.field_2._M_local_buf[0xe] = local_2b2;
  pBVar5 = Specification::NeuralNetworkLayer::batchnorm(local_20);
  Specification::BatchnormLayerParams::gamma(pBVar5,extraout_XMM0_Qa_00);
  WVar4 = valueType(param_00);
  local_2b3 = true;
  if (WVar4 != FLOAT16) {
    pBVar5 = Specification::NeuralNetworkLayer::batchnorm(local_20);
    pWVar6 = Specification::BatchnormLayerParams::beta(pBVar5);
    WVar4 = valueType(pWVar6);
    local_2b3 = true;
    if (WVar4 != FLOAT16) {
      pBVar5 = Specification::NeuralNetworkLayer::batchnorm(local_20);
      pWVar6 = Specification::BatchnormLayerParams::mean(pBVar5);
      WVar4 = valueType(pWVar6);
      local_2b3 = true;
      if (WVar4 != FLOAT16) {
        pBVar5 = Specification::NeuralNetworkLayer::batchnorm(local_20);
        pWVar6 = Specification::BatchnormLayerParams::variance(pBVar5);
        WVar4 = valueType(pWVar6);
        local_2b3 = WVar4 == FLOAT16;
      }
    }
  }
  err.field_2._M_local_buf[0xd] = local_2b3;
  pBVar5 = Specification::NeuralNetworkLayer::batchnorm(local_20);
  Specification::BatchnormLayerParams::gamma(pBVar5,extraout_XMM0_Qa_01);
  WVar4 = valueType(param_01);
  local_2b4 = true;
  if (WVar4 != UNSPECIFIED) {
    pBVar5 = Specification::NeuralNetworkLayer::batchnorm(local_20);
    pWVar6 = Specification::BatchnormLayerParams::beta(pBVar5);
    WVar4 = valueType(pWVar6);
    local_2b4 = true;
    if (WVar4 != UNSPECIFIED) {
      pBVar5 = Specification::NeuralNetworkLayer::batchnorm(local_20);
      pWVar6 = Specification::BatchnormLayerParams::mean(pBVar5);
      WVar4 = valueType(pWVar6);
      local_2b4 = true;
      if (WVar4 != UNSPECIFIED) {
        pBVar5 = Specification::NeuralNetworkLayer::batchnorm(local_20);
        pWVar6 = Specification::BatchnormLayerParams::variance(pBVar5);
        WVar4 = valueType(pWVar6);
        local_2b4 = WVar4 == UNSPECIFIED;
      }
    }
  }
  err.field_2._M_local_buf[0xc] = local_2b4;
  if ((((err.field_2._M_local_buf[0xe] & 1U) != 0) && ((err.field_2._M_local_buf[0xd] & 1U) != 0))
     || (local_2b4 != false)) {
    psVar7 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &num_channels,"Batchnorm layer \'",psVar7);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &num_channels,
                   "\' parameters have values for both full and half precision. Parameters should either be specified in half or full precision, mixed parameters are not supported."
                  );
    std::__cxx11::string::~string((string *)&num_channels);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_b0);
    local_38 = 1;
    std::__cxx11::string::~string((string *)local_b0);
    return __return_storage_ptr__;
  }
  pBVar5 = Specification::NeuralNetworkLayer::batchnorm(local_20);
  local_d8 = Specification::BatchnormLayerParams::channels(pBVar5);
  local_d9 = 0;
  pBVar5 = Specification::NeuralNetworkLayer::batchnorm(local_20);
  Specification::BatchnormLayerParams::gamma(pBVar5,extraout_XMM0_Qa_02);
  uVar1 = local_d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"BatchNorm",&local_101);
  psVar7 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"gamma",&local_129);
  validateGeneralWeightParams(__return_storage_ptr__,weight,uVar1,1,&local_100,psVar7,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  bVar3 = Result::good(__return_storage_ptr__);
  if (!bVar3) {
    local_d9 = 1;
  }
  local_38 = (uint)!bVar3;
  if ((local_d9 & 1) == 0) {
    Result::~Result(__return_storage_ptr__);
  }
  if (local_38 != 0) {
    return __return_storage_ptr__;
  }
  local_12a = 0;
  pBVar5 = Specification::NeuralNetworkLayer::batchnorm(local_20);
  pWVar6 = Specification::BatchnormLayerParams::beta(pBVar5);
  uVar1 = local_d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"BatchNorm",&local_151);
  psVar7 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,"beta",(allocator<char> *)(err_1.field_2._M_local_buf + 0xf));
  validateGeneralWeightParams(__return_storage_ptr__,pWVar6,uVar1,1,&local_150,psVar7,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator((allocator<char> *)(err_1.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator(&local_151);
  bVar3 = Result::good(__return_storage_ptr__);
  if (!bVar3) {
    local_12a = 1;
  }
  local_38 = (uint)!bVar3;
  if ((local_12a & 1) == 0) {
    Result::~Result(__return_storage_ptr__);
  }
  if (local_38 != 0) {
    return __return_storage_ptr__;
  }
  pBVar5 = Specification::NeuralNetworkLayer::batchnorm(local_20);
  bVar3 = Specification::BatchnormLayerParams::computemeanvar(pBVar5);
  if (bVar3) {
LAB_004befe0:
    Result::Result(__return_storage_ptr__);
  }
  else {
    pBVar5 = Specification::NeuralNetworkLayer::batchnorm(local_20);
    pWVar6 = Specification::BatchnormLayerParams::mean(pBVar5);
    WVar4 = valueType(pWVar6);
    if (WVar4 != EMPTY) {
      pBVar5 = Specification::NeuralNetworkLayer::batchnorm(local_20);
      pWVar6 = Specification::BatchnormLayerParams::mean(pBVar5);
      WVar4 = valueType(pWVar6);
      if (WVar4 != EMPTY) {
        local_1c1 = 0;
        pBVar5 = Specification::NeuralNetworkLayer::batchnorm(local_20);
        pWVar6 = Specification::BatchnormLayerParams::mean(pBVar5);
        uVar1 = local_d8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1e8,"BatchNorm",&local_1e9);
        psVar7 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"mean",&local_211);
        validateGeneralWeightParams
                  (__return_storage_ptr__,pWVar6,uVar1,1,&local_1e8,psVar7,&local_210);
        std::__cxx11::string::~string((string *)&local_210);
        std::allocator<char>::~allocator(&local_211);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::allocator<char>::~allocator(&local_1e9);
        bVar3 = Result::good(__return_storage_ptr__);
        if (!bVar3) {
          local_1c1 = 1;
        }
        local_38 = (uint)!bVar3;
        if ((local_1c1 & 1) == 0) {
          Result::~Result(__return_storage_ptr__);
        }
        if (local_38 != 0) {
          return __return_storage_ptr__;
        }
        local_212 = 0;
        pBVar5 = Specification::NeuralNetworkLayer::batchnorm(local_20);
        pWVar6 = Specification::BatchnormLayerParams::variance(pBVar5);
        uVar1 = local_d8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_238,"BatchNorm",&local_239);
        psVar7 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_260,"variance",&local_261);
        validateGeneralWeightParams
                  (__return_storage_ptr__,pWVar6,uVar1,1,&local_238,psVar7,&local_260);
        std::__cxx11::string::~string((string *)&local_260);
        std::allocator<char>::~allocator(&local_261);
        std::__cxx11::string::~string((string *)&local_238);
        std::allocator<char>::~allocator(&local_239);
        bVar3 = Result::good(__return_storage_ptr__);
        if (!bVar3) {
          local_212 = 1;
        }
        local_38 = (uint)!bVar3;
        if ((local_212 & 1) == 0) {
          Result::~Result(__return_storage_ptr__);
        }
        if (local_38 != 0) {
          return __return_storage_ptr__;
        }
        goto LAB_004befe0;
      }
    }
    psVar7 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
    std::operator+(&local_1c0,"Batchnorm layer \'",psVar7);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
                   &local_1c0,"\' is missing mean and variance.");
    std::__cxx11::string::~string((string *)&local_1c0);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_1a0);
    local_38 = 1;
    std::__cxx11::string::~string((string *)local_1a0);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateBatchnormLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "Batchnorm", blobNameToRank));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "Batchnorm", 3, -1, blobNameToRank));
    }

    // Check parameters types
    bool has_f32_params = ((valueType(layer.batchnorm().gamma()) == FLOAT32) || (valueType(layer.batchnorm().beta()) == FLOAT32) ||
                           (valueType(layer.batchnorm().mean()) == FLOAT32)  || (valueType(layer.batchnorm().variance()) == FLOAT32));
    bool has_f16_params = ((valueType(layer.batchnorm().gamma()) == FLOAT16) || (valueType(layer.batchnorm().beta()) == FLOAT16) ||
                           (valueType(layer.batchnorm().mean()) == FLOAT16)  || (valueType(layer.batchnorm().variance()) == FLOAT16));
    bool invalid_params = ((valueType(layer.batchnorm().gamma()) == UNSPECIFIED) || (valueType(layer.batchnorm().beta()) == UNSPECIFIED) ||
                           (valueType(layer.batchnorm().mean()) == UNSPECIFIED)  || (valueType(layer.batchnorm().variance()) == UNSPECIFIED));
    if ((has_f32_params && has_f16_params) || invalid_params) {
        std::string err = "Batchnorm layer '" + layer.name() + "' parameters have values for both full and half precision. Parameters "
        "should either be specified in half or full precision, mixed parameters are not supported.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    // Check parameters length
    uint64_t num_channels = static_cast<uint64_t>(layer.batchnorm().channels());
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(layer.batchnorm().gamma(), num_channels, 1, "BatchNorm", layer.name(), "gamma"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(layer.batchnorm().beta(), num_channels, 1, "BatchNorm", layer.name(), "beta"));

    // Check existence of mean / variance
    if (!layer.batchnorm().computemeanvar()) {
        if (valueType(layer.batchnorm().mean()) == EMPTY || valueType(layer.batchnorm().mean()) == EMPTY){
            const std::string err = "Batchnorm layer '" + layer.name() + "' is missing mean and variance.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(layer.batchnorm().mean(), num_channels, 1, "BatchNorm", layer.name(), "mean"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(layer.batchnorm().variance(), num_channels, 1, "BatchNorm", layer.name(), "variance"));
    }
    return Result();
}